

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectsource.cc
# Opt level: O2

void google::protobuf::util::converter::ProtoStreamObjectSource::InitRendererMap(void)

{
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(const_google::protobuf::util::converter::ProtoStreamObjectSource_*,_const_google::protobuf::Type_&,_google::protobuf::StringPiece,_google::protobuf::util::converter::ObjectWriter_*)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(const_google::protobuf::util::converter::ProtoStreamObjectSource_*,_const_google::protobuf::Type_&,_google::protobuf::StringPiece,_google::protobuf::util::converter::ObjectWriter_*)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *p_Var1;
  mapped_type *pp_Var2;
  key_type local_40;
  allocator local_19;
  
  p_Var1 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(const_google::protobuf::util::converter::ProtoStreamObjectSource_*,_const_google::protobuf::Type_&,_google::protobuf::StringPiece,_google::protobuf::util::converter::ObjectWriter_*)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(const_google::protobuf::util::converter::ProtoStreamObjectSource_*,_const_google::protobuf::Type_&,_google::protobuf::StringPiece,_google::protobuf::util::converter::ObjectWriter_*)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            *)operator_new(0x38);
  *(undefined8 *)(p_Var1 + 0x20) = 0;
  *(undefined8 *)(p_Var1 + 0x28) = 0;
  *(_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(const_google::protobuf::util::converter::ProtoStreamObjectSource_*,_const_google::protobuf::Type_&,_google::protobuf::StringPiece,_google::protobuf::util::converter::ObjectWriter_*)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(const_google::protobuf::util::converter::ProtoStreamObjectSource_*,_const_google::protobuf::Type_&,_google::protobuf::StringPiece,_google::protobuf::util::converter::ObjectWriter_*)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
    **)p_Var1 = p_Var1 + 0x30;
  *(undefined8 *)(p_Var1 + 8) = 1;
  *(undefined8 *)(p_Var1 + 0x10) = 0;
  *(undefined8 *)(p_Var1 + 0x18) = 0;
  *(undefined4 *)(p_Var1 + 0x20) = 0x3f800000;
  *(undefined8 *)(p_Var1 + 0x28) = 0;
  *(undefined8 *)(p_Var1 + 0x30) = 0;
  renderers__abi_cxx11_ = p_Var1;
  std::__cxx11::string::string((string *)&local_40,"google.protobuf.Timestamp",&local_19);
  pp_Var2 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(const_google::protobuf::util::converter::ProtoStreamObjectSource_*,_const_google::protobuf::Type_&,_google::protobuf::StringPiece,_google::protobuf::util::converter::ObjectWriter_*)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(const_google::protobuf::util::converter::ProtoStreamObjectSource_*,_const_google::protobuf::Type_&,_google::protobuf::StringPiece,_google::protobuf::util::converter::ObjectWriter_*)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[](p_Var1,&local_40);
  *pp_Var2 = RenderTimestamp;
  std::__cxx11::string::~string((string *)&local_40);
  p_Var1 = renderers__abi_cxx11_;
  std::__cxx11::string::string((string *)&local_40,"google.protobuf.Duration",&local_19);
  pp_Var2 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(const_google::protobuf::util::converter::ProtoStreamObjectSource_*,_const_google::protobuf::Type_&,_google::protobuf::StringPiece,_google::protobuf::util::converter::ObjectWriter_*)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(const_google::protobuf::util::converter::ProtoStreamObjectSource_*,_const_google::protobuf::Type_&,_google::protobuf::StringPiece,_google::protobuf::util::converter::ObjectWriter_*)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[](p_Var1,&local_40);
  *pp_Var2 = RenderDuration;
  std::__cxx11::string::~string((string *)&local_40);
  p_Var1 = renderers__abi_cxx11_;
  std::__cxx11::string::string((string *)&local_40,"google.protobuf.DoubleValue",&local_19);
  pp_Var2 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(const_google::protobuf::util::converter::ProtoStreamObjectSource_*,_const_google::protobuf::Type_&,_google::protobuf::StringPiece,_google::protobuf::util::converter::ObjectWriter_*)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(const_google::protobuf::util::converter::ProtoStreamObjectSource_*,_const_google::protobuf::Type_&,_google::protobuf::StringPiece,_google::protobuf::util::converter::ObjectWriter_*)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[](p_Var1,&local_40);
  *pp_Var2 = RenderDouble;
  std::__cxx11::string::~string((string *)&local_40);
  p_Var1 = renderers__abi_cxx11_;
  std::__cxx11::string::string((string *)&local_40,"google.protobuf.FloatValue",&local_19);
  pp_Var2 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(const_google::protobuf::util::converter::ProtoStreamObjectSource_*,_const_google::protobuf::Type_&,_google::protobuf::StringPiece,_google::protobuf::util::converter::ObjectWriter_*)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(const_google::protobuf::util::converter::ProtoStreamObjectSource_*,_const_google::protobuf::Type_&,_google::protobuf::StringPiece,_google::protobuf::util::converter::ObjectWriter_*)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[](p_Var1,&local_40);
  *pp_Var2 = RenderFloat;
  std::__cxx11::string::~string((string *)&local_40);
  p_Var1 = renderers__abi_cxx11_;
  std::__cxx11::string::string((string *)&local_40,"google.protobuf.Int64Value",&local_19);
  pp_Var2 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(const_google::protobuf::util::converter::ProtoStreamObjectSource_*,_const_google::protobuf::Type_&,_google::protobuf::StringPiece,_google::protobuf::util::converter::ObjectWriter_*)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(const_google::protobuf::util::converter::ProtoStreamObjectSource_*,_const_google::protobuf::Type_&,_google::protobuf::StringPiece,_google::protobuf::util::converter::ObjectWriter_*)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[](p_Var1,&local_40);
  *pp_Var2 = RenderInt64;
  std::__cxx11::string::~string((string *)&local_40);
  p_Var1 = renderers__abi_cxx11_;
  std::__cxx11::string::string((string *)&local_40,"google.protobuf.UInt64Value",&local_19);
  pp_Var2 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(const_google::protobuf::util::converter::ProtoStreamObjectSource_*,_const_google::protobuf::Type_&,_google::protobuf::StringPiece,_google::protobuf::util::converter::ObjectWriter_*)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(const_google::protobuf::util::converter::ProtoStreamObjectSource_*,_const_google::protobuf::Type_&,_google::protobuf::StringPiece,_google::protobuf::util::converter::ObjectWriter_*)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[](p_Var1,&local_40);
  *pp_Var2 = RenderUInt64;
  std::__cxx11::string::~string((string *)&local_40);
  p_Var1 = renderers__abi_cxx11_;
  std::__cxx11::string::string((string *)&local_40,"google.protobuf.Int32Value",&local_19);
  pp_Var2 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(const_google::protobuf::util::converter::ProtoStreamObjectSource_*,_const_google::protobuf::Type_&,_google::protobuf::StringPiece,_google::protobuf::util::converter::ObjectWriter_*)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(const_google::protobuf::util::converter::ProtoStreamObjectSource_*,_const_google::protobuf::Type_&,_google::protobuf::StringPiece,_google::protobuf::util::converter::ObjectWriter_*)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[](p_Var1,&local_40);
  *pp_Var2 = RenderInt32;
  std::__cxx11::string::~string((string *)&local_40);
  p_Var1 = renderers__abi_cxx11_;
  std::__cxx11::string::string((string *)&local_40,"google.protobuf.UInt32Value",&local_19);
  pp_Var2 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(const_google::protobuf::util::converter::ProtoStreamObjectSource_*,_const_google::protobuf::Type_&,_google::protobuf::StringPiece,_google::protobuf::util::converter::ObjectWriter_*)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(const_google::protobuf::util::converter::ProtoStreamObjectSource_*,_const_google::protobuf::Type_&,_google::protobuf::StringPiece,_google::protobuf::util::converter::ObjectWriter_*)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[](p_Var1,&local_40);
  *pp_Var2 = RenderUInt32;
  std::__cxx11::string::~string((string *)&local_40);
  p_Var1 = renderers__abi_cxx11_;
  std::__cxx11::string::string((string *)&local_40,"google.protobuf.BoolValue",&local_19);
  pp_Var2 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(const_google::protobuf::util::converter::ProtoStreamObjectSource_*,_const_google::protobuf::Type_&,_google::protobuf::StringPiece,_google::protobuf::util::converter::ObjectWriter_*)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(const_google::protobuf::util::converter::ProtoStreamObjectSource_*,_const_google::protobuf::Type_&,_google::protobuf::StringPiece,_google::protobuf::util::converter::ObjectWriter_*)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[](p_Var1,&local_40);
  *pp_Var2 = RenderBool;
  std::__cxx11::string::~string((string *)&local_40);
  p_Var1 = renderers__abi_cxx11_;
  std::__cxx11::string::string((string *)&local_40,"google.protobuf.StringValue",&local_19);
  pp_Var2 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(const_google::protobuf::util::converter::ProtoStreamObjectSource_*,_const_google::protobuf::Type_&,_google::protobuf::StringPiece,_google::protobuf::util::converter::ObjectWriter_*)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(const_google::protobuf::util::converter::ProtoStreamObjectSource_*,_const_google::protobuf::Type_&,_google::protobuf::StringPiece,_google::protobuf::util::converter::ObjectWriter_*)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[](p_Var1,&local_40);
  *pp_Var2 = RenderString;
  std::__cxx11::string::~string((string *)&local_40);
  p_Var1 = renderers__abi_cxx11_;
  std::__cxx11::string::string((string *)&local_40,"google.protobuf.BytesValue",&local_19);
  pp_Var2 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(const_google::protobuf::util::converter::ProtoStreamObjectSource_*,_const_google::protobuf::Type_&,_google::protobuf::StringPiece,_google::protobuf::util::converter::ObjectWriter_*)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(const_google::protobuf::util::converter::ProtoStreamObjectSource_*,_const_google::protobuf::Type_&,_google::protobuf::StringPiece,_google::protobuf::util::converter::ObjectWriter_*)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[](p_Var1,&local_40);
  *pp_Var2 = RenderBytes;
  std::__cxx11::string::~string((string *)&local_40);
  p_Var1 = renderers__abi_cxx11_;
  std::__cxx11::string::string((string *)&local_40,"google.protobuf.Any",&local_19);
  pp_Var2 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(const_google::protobuf::util::converter::ProtoStreamObjectSource_*,_const_google::protobuf::Type_&,_google::protobuf::StringPiece,_google::protobuf::util::converter::ObjectWriter_*)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(const_google::protobuf::util::converter::ProtoStreamObjectSource_*,_const_google::protobuf::Type_&,_google::protobuf::StringPiece,_google::protobuf::util::converter::ObjectWriter_*)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[](p_Var1,&local_40);
  *pp_Var2 = RenderAny;
  std::__cxx11::string::~string((string *)&local_40);
  p_Var1 = renderers__abi_cxx11_;
  std::__cxx11::string::string((string *)&local_40,"google.protobuf.Struct",&local_19);
  pp_Var2 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(const_google::protobuf::util::converter::ProtoStreamObjectSource_*,_const_google::protobuf::Type_&,_google::protobuf::StringPiece,_google::protobuf::util::converter::ObjectWriter_*)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(const_google::protobuf::util::converter::ProtoStreamObjectSource_*,_const_google::protobuf::Type_&,_google::protobuf::StringPiece,_google::protobuf::util::converter::ObjectWriter_*)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[](p_Var1,&local_40);
  *pp_Var2 = RenderStruct;
  std::__cxx11::string::~string((string *)&local_40);
  p_Var1 = renderers__abi_cxx11_;
  std::__cxx11::string::string((string *)&local_40,"google.protobuf.Value",&local_19);
  pp_Var2 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(const_google::protobuf::util::converter::ProtoStreamObjectSource_*,_const_google::protobuf::Type_&,_google::protobuf::StringPiece,_google::protobuf::util::converter::ObjectWriter_*)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(const_google::protobuf::util::converter::ProtoStreamObjectSource_*,_const_google::protobuf::Type_&,_google::protobuf::StringPiece,_google::protobuf::util::converter::ObjectWriter_*)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[](p_Var1,&local_40);
  *pp_Var2 = RenderStructValue;
  std::__cxx11::string::~string((string *)&local_40);
  p_Var1 = renderers__abi_cxx11_;
  std::__cxx11::string::string((string *)&local_40,"google.protobuf.ListValue",&local_19);
  pp_Var2 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(const_google::protobuf::util::converter::ProtoStreamObjectSource_*,_const_google::protobuf::Type_&,_google::protobuf::StringPiece,_google::protobuf::util::converter::ObjectWriter_*)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(const_google::protobuf::util::converter::ProtoStreamObjectSource_*,_const_google::protobuf::Type_&,_google::protobuf::StringPiece,_google::protobuf::util::converter::ObjectWriter_*)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[](p_Var1,&local_40);
  *pp_Var2 = RenderStructListValue;
  std::__cxx11::string::~string((string *)&local_40);
  p_Var1 = renderers__abi_cxx11_;
  std::__cxx11::string::string((string *)&local_40,"google.protobuf.FieldMask",&local_19);
  pp_Var2 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(const_google::protobuf::util::converter::ProtoStreamObjectSource_*,_const_google::protobuf::Type_&,_google::protobuf::StringPiece,_google::protobuf::util::converter::ObjectWriter_*)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(const_google::protobuf::util::converter::ProtoStreamObjectSource_*,_const_google::protobuf::Type_&,_google::protobuf::StringPiece,_google::protobuf::util::converter::ObjectWriter_*)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[](p_Var1,&local_40);
  *pp_Var2 = RenderFieldMask;
  std::__cxx11::string::~string((string *)&local_40);
  protobuf::internal::OnShutdown(DeleteRendererMap);
  return;
}

Assistant:

void ProtoStreamObjectSource::InitRendererMap() {
  renderers_ = new std::unordered_map<std::string,
                                      ProtoStreamObjectSource::TypeRenderer>();
  (*renderers_)["google.protobuf.Timestamp"] =
      &ProtoStreamObjectSource::RenderTimestamp;
  (*renderers_)["google.protobuf.Duration"] =
      &ProtoStreamObjectSource::RenderDuration;
  (*renderers_)["google.protobuf.DoubleValue"] =
      &ProtoStreamObjectSource::RenderDouble;
  (*renderers_)["google.protobuf.FloatValue"] =
      &ProtoStreamObjectSource::RenderFloat;
  (*renderers_)["google.protobuf.Int64Value"] =
      &ProtoStreamObjectSource::RenderInt64;
  (*renderers_)["google.protobuf.UInt64Value"] =
      &ProtoStreamObjectSource::RenderUInt64;
  (*renderers_)["google.protobuf.Int32Value"] =
      &ProtoStreamObjectSource::RenderInt32;
  (*renderers_)["google.protobuf.UInt32Value"] =
      &ProtoStreamObjectSource::RenderUInt32;
  (*renderers_)["google.protobuf.BoolValue"] =
      &ProtoStreamObjectSource::RenderBool;
  (*renderers_)["google.protobuf.StringValue"] =
      &ProtoStreamObjectSource::RenderString;
  (*renderers_)["google.protobuf.BytesValue"] =
      &ProtoStreamObjectSource::RenderBytes;
  (*renderers_)["google.protobuf.Any"] = &ProtoStreamObjectSource::RenderAny;
  (*renderers_)["google.protobuf.Struct"] =
      &ProtoStreamObjectSource::RenderStruct;
  (*renderers_)["google.protobuf.Value"] =
      &ProtoStreamObjectSource::RenderStructValue;
  (*renderers_)["google.protobuf.ListValue"] =
      &ProtoStreamObjectSource::RenderStructListValue;
  (*renderers_)["google.protobuf.FieldMask"] =
      &ProtoStreamObjectSource::RenderFieldMask;
  ::google::protobuf::internal::OnShutdown(&DeleteRendererMap);
}